

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

int bifinh(voccxdef *voc,vocidef *v,objnum cls)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  
  if (v == (vocidef *)0x0) {
    return 0;
  }
  bVar1 = v->vocinsc;
  lVar4 = 0;
  while( true ) {
    if ((uint)bVar1 == (uint)lVar4) {
      return 0;
    }
    uVar2 = *(ushort *)((long)&v->vociu + lVar4 * 2 + 6);
    if ((uVar2 == cls) ||
       (iVar3 = bifinh(voc,voc->voccxinh[uVar2 >> 8][(byte)uVar2],cls), iVar3 != 0)) break;
    lVar4 = lVar4 + 1;
  }
  return 1;
}

Assistant:

int bifinh(voccxdef *voc, vocidef *v, objnum cls)
{
    int     i;
    objnum *sc;

    if (!v) return(FALSE);
    for (i = v->vocinsc, sc = v->vocisc ; i ; ++sc, --i)
    {
        if (*sc == cls
            || bifinh(voc, vocinh(voc, *sc), cls))
            return(TRUE);
    }
    return(FALSE);
}